

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boolean.h
# Opt level: O0

string * __thiscall Boolean::asString_abi_cxx11_(string *__return_storage_ptr__,Boolean *this)

{
  char *__s;
  allocator<char> local_19;
  Boolean *local_18;
  Boolean *this_local;
  
  __s = "false";
  if ((this->value & 1U) != 0) {
    __s = "true";
  }
  local_18 = this;
  this_local = (Boolean *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_19)
  ;
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string asString() override {
        return value ? "true" : "false";
    }